

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall EmmyDebuggerManager::RemoveAllBreakpoints(EmmyDebuggerManager *this)

{
  std::mutex::lock(&this->breakpointsMtx);
  std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::clear
            (&this->breakpoints);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->lineSet)._M_t);
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointsMtx);
  return;
}

Assistant:

void EmmyDebuggerManager::RemoveAllBreakpoints()
{
	std::lock_guard<std::mutex> lock(breakpointsMtx);
	breakpoints.clear();
	lineSet.clear();
}